

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ber_decoder.c
# Opt level: O3

asn_dec_rval_t
ber_check_tags(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,asn_struct_ctx_t *opt_ctx,
              void *ptr,size_t size,int tag_mode,int last_tag_form,ber_tlv_len_t *last_length,
              int *opt_tlv_form)

{
  size_t num_1;
  undefined8 uVar1;
  ssize_t sVar2;
  ssize_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  short sVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  bool bVar13;
  asn_dec_rval_t aVar14;
  ber_tlv_len_t tlv_len;
  uint local_50;
  ber_tlv_tag_t local_4c;
  asn_TYPE_descriptor_t *local_48;
  int local_3c;
  long local_38;
  
  if (opt_ctx == (asn_struct_ctx_t *)0x0) {
    iVar8 = 0;
  }
  else {
    iVar8 = (int)opt_ctx->step;
  }
  if ((opt_codec_ctx == (asn_codec_ctx_t *)0x0) ||
     (sVar5 = opt_codec_ctx->max_stack_size, sVar5 == 0)) {
LAB_0014aaa6:
    iVar11 = iVar8 - (uint)(tag_mode == 1);
    local_50 = 0xffffffff;
    local_48 = td;
    local_3c = tag_mode;
    if ((tag_mode == 0) && (iVar11 == td->tags_count)) {
      sVar2 = ber_fetch_tag(ptr,size,&local_4c);
      if (sVar2 == 0) {
LAB_0014ad20:
        uVar1 = 1;
      }
      else {
        if (sVar2 != -1) {
          local_50 = *ptr >> 5 & 1;
          sVar3 = ber_fetch_length(local_50,(void *)((long)ptr + sVar2),size - sVar2,&local_38);
          if (sVar3 == 0) goto LAB_0014ad20;
          if (sVar3 != -1) {
            sVar5 = sVar3 + sVar2;
            ptr = (void *)((long)ptr + sVar5);
            size = size - sVar5;
            goto LAB_0014ab43;
          }
        }
        uVar1 = 2;
      }
      sVar5 = 0;
      sVar7 = (short)iVar8;
      goto joined_r0x0014ad2e;
    }
    sVar5 = 0;
LAB_0014ab43:
    iVar10 = 0;
    if (iVar11 < local_48->tags_count) {
      lVar12 = (long)iVar11;
      sVar6 = 0xffffffffffffffff;
      iVar10 = 0;
      do {
        sVar2 = ber_fetch_tag(ptr,size,&local_4c);
        ber_tlv_tag_string(local_4c);
        sVar7 = (short)iVar8;
        if (sVar2 == 0) {
          uVar1 = 1;
LAB_0014ad6e:
          if (opt_ctx != (asn_struct_ctx_t *)0x0) goto LAB_0014ad81;
LAB_0014ad94:
          sVar5 = 0;
          goto LAB_0014ad85;
        }
        if (sVar2 == -1) {
LAB_0014ad69:
          uVar1 = 2;
          goto LAB_0014ad6e;
        }
        if (((local_3c == 0) || (iVar8 != 0)) && (local_4c != local_48->tags[lVar12])) {
          ber_tlv_tag_string(local_48->tags[lVar12]);
          goto LAB_0014ad69;
        }
        local_50 = *ptr >> 5 & 1;
        if (lVar12 < (long)local_48->tags_count + -1) {
          if ((char)local_50 == '\0') goto LAB_0014ad69;
        }
        else if ((last_tag_form != -1) && (local_50 != last_tag_form)) goto LAB_0014ad69;
        sVar3 = ber_fetch_length(local_50,(byte *)((long)ptr + sVar2),size - sVar2,&local_38);
        if (sVar3 == 0) {
          uVar1 = 1;
joined_r0x0014ad4b:
          if (opt_ctx == (asn_struct_ctx_t *)0x0) goto LAB_0014ad94;
          goto LAB_0014ad81;
        }
        if (sVar3 == -1) {
LAB_0014ad0f:
          uVar1 = 2;
          goto joined_r0x0014ad4b;
        }
        if (local_38 != -1) {
          if (iVar10 == 0) {
            lVar9 = sVar3 + sVar2;
            sVar4 = local_38 + lVar9;
            if (sVar6 == 0xffffffffffffffff) {
              if (-1 < (long)sVar4) goto LAB_0014aca4;
            }
            else {
              bVar13 = sVar6 == sVar4;
              sVar4 = sVar6;
              if (bVar13) {
LAB_0014aca4:
                size = size - lVar9;
                sVar6 = sVar4 - lVar9;
                if ((long)sVar6 <= (long)size) {
                  size = sVar6;
                }
                iVar10 = 0;
                goto LAB_0014acb7;
              }
            }
            uVar1 = 2;
            goto joined_r0x0014ad4b;
          }
          goto LAB_0014ad0f;
        }
        if (sVar6 != 0xffffffffffffffff) goto LAB_0014ad0f;
        iVar10 = iVar10 + 1;
        size = size - (sVar3 + sVar2);
        sVar6 = 0xffffffffffffffff;
LAB_0014acb7:
        ptr = (void *)((long)ptr + sVar3 + sVar2);
        sVar5 = sVar5 + sVar3 + sVar2;
        lVar12 = lVar12 + 1;
        iVar8 = iVar8 + 1;
      } while (lVar12 < local_48->tags_count);
    }
    if (opt_tlv_form != (int *)0x0) {
      *opt_tlv_form = local_50;
    }
    if (iVar10 != 0) {
      local_38 = (long)-iVar10;
    }
    uVar1 = 0;
    *last_length = local_38;
  }
  else {
    lVar9 = (long)opt_codec_ctx - (long)&local_38;
    lVar12 = -lVar9;
    if (lVar9 < 1) {
      lVar12 = lVar9;
    }
    if (SBORROW8(lVar12,-sVar5) == (long)(lVar12 + sVar5) < 0) goto LAB_0014aaa6;
    sVar5 = 0;
    uVar1 = 2;
  }
  sVar7 = (short)iVar8;
joined_r0x0014ad2e:
  if (opt_ctx != (asn_struct_ctx_t *)0x0) {
LAB_0014ad81:
    opt_ctx->step = sVar7;
  }
LAB_0014ad85:
  aVar14.consumed = sVar5;
  aVar14._0_8_ = uVar1;
  return aVar14;
}

Assistant:

asn_dec_rval_t
ber_check_tags(asn_codec_ctx_t *opt_codec_ctx,
		asn_TYPE_descriptor_t *td, asn_struct_ctx_t *opt_ctx,
		const void *ptr, size_t size, int tag_mode, int last_tag_form,
		ber_tlv_len_t *last_length, int *opt_tlv_form) {
	ssize_t consumed_myself = 0;
	ssize_t tag_len;
	ssize_t len_len;
	ber_tlv_tag_t tlv_tag;
	ber_tlv_len_t tlv_len;
	ber_tlv_len_t limit_len = -1;
	int expect_00_terminators = 0;
	int tlv_constr = -1;	/* If CHOICE, opt_tlv_form is not given */
	int step = opt_ctx ? opt_ctx->step : 0;	/* Where we left previously */
	int tagno;

	/*
	 * Make sure we didn't exceed the maximum stack size.
	 */
	if(ASN__STACK_OVERFLOW_CHECK(opt_codec_ctx))
		RETURN(RC_FAIL);

	/*
	 * So what does all this implicit skip stuff mean?
	 * Imagine two types,
	 * 	A ::= [5] IMPLICIT	T
	 * 	B ::= [2] EXPLICIT	T
	 * Where T is defined as
	 *	T ::= [4] IMPLICIT SEQUENCE { ... }
	 * 
	 * Let's say, we are starting to decode type A, given the
	 * following TLV stream: <5> <0>. What does this mean?
	 * It means that the type A contains type T which is,
	 * in turn, empty.
	 * Remember though, that we are still in A. We cannot
	 * just pass control to the type T decoder. Why? Because
	 * the type T decoder expects <4> <0>, not <5> <0>.
	 * So, we must make sure we are going to receive <5> while
	 * still in A, then pass control to the T decoder, indicating
	 * that the tag <4> was implicitly skipped. The decoder of T
	 * hence will be prepared to treat <4> as valid tag, and decode
	 * it appropriately.
	 */

	tagno = step	/* Continuing where left previously */
		+ (tag_mode==1?-1:0)
		;
	ASN_DEBUG("ber_check_tags(%s, size=%ld, tm=%d, step=%d, tagno=%d)",
		td->name, (long)size, tag_mode, step, tagno);
	/* assert(td->tags_count >= 1) May not be the case for CHOICE or ANY */

	if(tag_mode == 0 && tagno == td->tags_count) {
		/*
		 * This must be the _untagged_ ANY type,
		 * which outermost tag isn't known in advance.
		 * Fetch the tag and length separately.
		 */
		tag_len = ber_fetch_tag(ptr, size, &tlv_tag);
		switch(tag_len) {
		case -1: RETURN(RC_FAIL);
		case 0: RETURN(RC_WMORE);
		}
		tlv_constr = BER_TLV_CONSTRUCTED(ptr);
		len_len = ber_fetch_length(tlv_constr,
			(const char *)ptr + tag_len, size - tag_len, &tlv_len);
		switch(len_len) {
		case -1: RETURN(RC_FAIL);
		case 0: RETURN(RC_WMORE);
		}
		ASN_DEBUG("Advancing %ld in ANY case",
			(long)(tag_len + len_len));
		ADVANCE(tag_len + len_len);
	} else {
		assert(tagno < td->tags_count);	/* At least one loop */
	}
	for((void)tagno; tagno < td->tags_count; tagno++, step++) {

		/*
		 * Fetch and process T from TLV.
		 */
		tag_len = ber_fetch_tag(ptr, size, &tlv_tag);
			ASN_DEBUG("Fetching tag from {%p,%ld}: "
				"len %ld, step %d, tagno %d got %s",
				ptr, (long)size,
				(long)tag_len, step, tagno,
				ber_tlv_tag_string(tlv_tag));
		switch(tag_len) {
		case -1: RETURN(RC_FAIL);
		case 0: RETURN(RC_WMORE);
		}

		tlv_constr = BER_TLV_CONSTRUCTED(ptr);

		/*
		 * If {I}, don't check anything.
		 * If {I,B,C}, check B and C unless we're at I.
		 */
		if(tag_mode != 0 && step == 0) {
			/*
			 * We don't expect tag to match here.
			 * It's just because we don't know how the tag
			 * is supposed to look like.
			 */
		} else {
		    assert(tagno >= 0);	/* Guaranteed by the code above */
		    if(tlv_tag != td->tags[tagno]) {
			/*
			 * Unexpected tag. Too bad.
			 */
		    	ASN_DEBUG("Expected: %s, "
				"expectation failed (tn=%d, tm=%d)",
				ber_tlv_tag_string(td->tags[tagno]),
				tagno, tag_mode
			);
			RETURN(RC_FAIL);
		    }
		}

		/*
		 * Attention: if there are more tags expected,
		 * ensure that the current tag is presented
		 * in constructed form (it contains other tags!).
		 * If this one is the last one, check that the tag form
		 * matches the one given in descriptor.
		 */
		if(tagno < (td->tags_count - 1)) {
			if(tlv_constr == 0) {
				ASN_DEBUG("tlv_constr = %d, expfail",
					tlv_constr);
				RETURN(RC_FAIL);
			}
		} else {
			if(last_tag_form != tlv_constr
			&& last_tag_form != -1) {
				ASN_DEBUG("last_tag_form %d != %d",
					last_tag_form, tlv_constr);
				RETURN(RC_FAIL);
			}
		}

		/*
		 * Fetch and process L from TLV.
		 */
		len_len = ber_fetch_length(tlv_constr,
			(const char *)ptr + tag_len, size - tag_len, &tlv_len);
		ASN_DEBUG("Fetching len = %ld", (long)len_len);
		switch(len_len) {
		case -1: RETURN(RC_FAIL);
		case 0: RETURN(RC_WMORE);
		}

		/*
		 * FIXME
		 * As of today, the chain of tags
		 * must either contain several indefinite length TLVs,
		 * or several definite length ones.
		 * No mixing is allowed.
		 */
		if(tlv_len == -1) {
			/*
			 * Indefinite length.
			 */
			if(limit_len == -1) {
				expect_00_terminators++;
			} else {
				ASN_DEBUG("Unexpected indefinite length "
					"in a chain of definite lengths");
				RETURN(RC_FAIL);
			}
			ADVANCE(tag_len + len_len);
			continue;
		} else {
			if(expect_00_terminators) {
				ASN_DEBUG("Unexpected definite length "
					"in a chain of indefinite lengths");
				RETURN(RC_FAIL);
			}
		}

		/*
		 * Check that multiple TLVs specify ever decreasing length,
		 * which is consistent.
		 */
		if(limit_len == -1) {
			limit_len    = tlv_len + tag_len + len_len;
			if(limit_len < 0) {
				/* Too great tlv_len value? */
				RETURN(RC_FAIL);
			}
		} else if(limit_len != tlv_len + tag_len + len_len) {
			/*
			 * Inner TLV specifies length which is inconsistent
			 * with the outer TLV's length value.
			 */
			ASN_DEBUG("Outer TLV is %ld and inner is %ld",
				(long)limit_len, (long)tlv_len);
			RETURN(RC_FAIL);
		}

		ADVANCE(tag_len + len_len);

		limit_len -= (tag_len + len_len);
		if((ssize_t)size > limit_len) {
			/*
			 * Make sure that we won't consume more bytes
			 * from the parent frame than the inferred limit.
			 */
			size = limit_len;
		}
	}

	if(opt_tlv_form)
		*opt_tlv_form = tlv_constr;
	if(expect_00_terminators)
		*last_length = -expect_00_terminators;
	else
		*last_length = tlv_len;

	RETURN(RC_OK);
}